

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  uint uVar1;
  uint t_00;
  bool bVar2;
  degree_t dVar3;
  KReach *this;
  DynamicKReach *this_00;
  ScalableKReach *this_01;
  DynamicScalableKReach *this_02;
  pointer pAVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  reference puVar6;
  reference ppVar7;
  ostream *poVar8;
  type pAVar9;
  type pAVar10;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *local_3f8;
  unique_ptr<AbstractKReach,std::default_delete<AbstractKReach>> *local_310;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *j_3;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__end3_3;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__begin3_3;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> (*__range3_3) [4];
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *i_8;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__end2_8;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__begin2_8;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> (*__range2_8) [4];
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *i_7;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__end2_7;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__begin2_7;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> (*__range2_7) [4];
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *j_2;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__end3_2;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__begin3_2;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> (*__range3_2) [4];
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *i_6;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__end2_6;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__begin2_6;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> (*__range2_6) [4];
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *i_5;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__end2_5;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__begin2_5;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> (*__range2_5) [4];
  vector<unsigned_int,_std::allocator<unsigned_int>_> in;
  vector<unsigned_int,_std::allocator<unsigned_int>_> out;
  vertex_t s_2;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *j_1;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__end3_1;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__begin3_1;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> (*__range3_1) [4];
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *i_4;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__end2_4;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__begin2_4;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> (*__range2_4) [4];
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *i_3;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__end2_3;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__begin2_3;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> (*__range2_3) [4];
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *j;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__end3;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__begin3;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> (*__range3) [4];
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *i_2;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__end2_2;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__begin2_2;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> (*__range2_2) [4];
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *i_1;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__end2_1;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__begin2_1;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> (*__range2_1) [4];
  uint t_1;
  uint s_1;
  pair<unsigned_int,_unsigned_int> *p;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range1_1;
  uint local_114;
  const_iterator cStack_110;
  vertex_t t;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  undefined1 local_f0 [4];
  vertex_t s;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  edges;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *i;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__end1;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *__begin1;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> (*__range1) [4];
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> indexes [4];
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  Graph graph;
  
  graph._76_4_ = 0;
  Graph::Graph((Graph *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"data/sample.kreach",&local_81);
  Graph::from_kreach((Graph *)local_60,(string *)local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  Graph::compute_degree((Graph *)local_60);
  local_310 = (unique_ptr<AbstractKReach,std::default_delete<AbstractKReach>> *)&__range1;
  do {
    std::unique_ptr<AbstractKReach,std::default_delete<AbstractKReach>>::
    unique_ptr<std::default_delete<AbstractKReach>,void>(local_310);
    local_310 = local_310 + 8;
  } while (local_310 !=
           (unique_ptr<AbstractKReach,std::default_delete<AbstractKReach>> *)(indexes + 3));
  this = (KReach *)operator_new(0xb0);
  KReach::KReach(this,(Graph *)local_60,'\x03');
  std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::reset
            ((unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *)&__range1,
             (pointer)this);
  this_00 = (DynamicKReach *)operator_new(0x120);
  DynamicKReach::DynamicKReach(this_00,(Graph *)local_60,'\x03');
  std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::reset
            (indexes,(pointer)this_00);
  this_01 = (ScalableKReach *)operator_new(0x200);
  ScalableKReach::ScalableKReach(this_01,(Graph *)local_60,'\x03',1000,10000);
  std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::reset
            (indexes + 1,(pointer)this_01);
  this_02 = (DynamicScalableKReach *)operator_new(0x338);
  DynamicScalableKReach::DynamicScalableKReach(this_02,(Graph *)local_60,'\x03',1000,10000);
  std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::reset
            (indexes + 2,(pointer)this_02);
  for (__end1 = (unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *)&__range1;
      __end1 != indexes + 3; __end1 = __end1 + 1) {
    edges.
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__end1;
    pAVar4 = std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::operator->
                       (__end1);
    (**pAVar4->_vptr_AbstractKReach)();
  }
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)local_f0);
  __range2._4_4_ = 0;
  while( true ) {
    uVar1 = __range2._4_4_;
    dVar3 = Graph::num_vertices((Graph *)local_60);
    if (dVar3 <= uVar1) break;
    pvVar5 = Graph::successors((Graph *)local_60,__range2._4_4_);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar5);
    cStack_110 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar5);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffef0);
      if (!bVar2) break;
      puVar6 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2);
      local_114 = *puVar6;
      register0x00000000 =
           std::make_pair<unsigned_int&,unsigned_int&>((uint *)((long)&__range2 + 4),&local_114);
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_f0,(value_type *)((long)&__range1_1 + 4));
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end2);
    }
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  __end1_1 = std::
             vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ::begin((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      *)local_f0);
  p = (pair<unsigned_int,_unsigned_int> *)
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::end((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)local_f0);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                        *)&p);
    if (!bVar2) break;
    ppVar7 = __gnu_cxx::
             __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
             ::operator*(&__end1_1);
    uVar1 = ppVar7->first;
    t_00 = ppVar7->second;
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar1);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,t_00);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    Graph::remove_edge((Graph *)local_60,uVar1,t_00);
    for (__end2_1 = (unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *)&__range1;
        __end2_1 != indexes + 3; __end2_1 = __end2_1 + 1) {
      pAVar4 = std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::operator->
                         (__end2_1);
      (*pAVar4->_vptr_AbstractKReach[3])(pAVar4,(ulong)uVar1,(ulong)t_00);
    }
    for (__end2_2 = (unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *)&__range1;
        __end2_2 != indexes + 3; __end2_2 = __end2_2 + 1) {
      for (__end3 = (unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *)&__range1;
          __end3 != indexes + 3; __end3 = __end3 + 1) {
        pAVar9 = std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::operator*
                           (__end2_2);
        pAVar10 = std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::operator*
                            (__end3);
        equals((Graph *)local_60,pAVar9,pAVar10);
      }
    }
    Graph::insert_edge((Graph *)local_60,uVar1,t_00);
    for (__end2_3 = (unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *)&__range1;
        __end2_3 != indexes + 3; __end2_3 = __end2_3 + 1) {
      pAVar4 = std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::operator->
                         (__end2_3);
      (*pAVar4->_vptr_AbstractKReach[2])(pAVar4,(ulong)uVar1,(ulong)t_00);
    }
    for (__end2_4 = (unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *)&__range1;
        __end2_4 != indexes + 3; __end2_4 = __end2_4 + 1) {
      for (__end3_1 = (unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *)&__range1;
          __end3_1 != indexes + 3; __end3_1 = __end3_1 + 1) {
        pAVar9 = std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::operator*
                           (__end2_4);
        pAVar10 = std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::operator*
                            (__end3_1);
        equals((Graph *)local_60,pAVar9,pAVar10);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::operator++(&__end1_1);
  }
  out.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    dVar3 = Graph::num_vertices((Graph *)local_60);
    if (dVar3 <= out.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_) break;
    poVar8 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        out.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    pvVar5 = Graph::successors((Graph *)local_60,
                               out.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &in.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,pvVar5);
    pvVar5 = Graph::predecessors((Graph *)local_60,
                                 out.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_5,pvVar5);
    Graph::remove_vertex
              ((Graph *)local_60,
               out.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_);
    for (__end2_5 = (unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *)&__range1;
        __end2_5 != indexes + 3; __end2_5 = __end2_5 + 1) {
      pAVar4 = std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::operator->
                         (__end2_5);
      (*pAVar4->_vptr_AbstractKReach[4])
                (pAVar4,(ulong)out.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                 &in.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&__range2_5);
    }
    for (__end2_6 = (unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *)&__range1;
        __end2_6 != indexes + 3; __end2_6 = __end2_6 + 1) {
      for (__end3_2 = (unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *)&__range1;
          __end3_2 != indexes + 3; __end3_2 = __end3_2 + 1) {
        pAVar9 = std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::operator*
                           (__end2_6);
        pAVar10 = std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::operator*
                            (__end3_2);
        equals((Graph *)local_60,pAVar9,pAVar10);
      }
    }
    Graph::insert_vertex
              ((Graph *)local_60,
               out.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &in.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_5);
    for (__end2_7 = (unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *)&__range1;
        __end2_7 != indexes + 3; __end2_7 = __end2_7 + 1) {
      pAVar4 = std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::operator->
                         (__end2_7);
      (*pAVar4->_vptr_AbstractKReach[5])
                (pAVar4,(ulong)out.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                 &in.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&__range2_5);
    }
    for (__end2_8 = (unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *)&__range1;
        __end2_8 != indexes + 3; __end2_8 = __end2_8 + 1) {
      for (__end3_3 = (unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *)&__range1;
          __end3_3 != indexes + 3; __end3_3 = __end3_3 + 1) {
        pAVar9 = std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::operator*
                           (__end2_8);
        pAVar10 = std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::operator*
                            (__end3_3);
        equals((Graph *)local_60,pAVar9,pAVar10);
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &in.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    out.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         out.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  graph._76_4_ = 0;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)local_f0);
  local_3f8 = indexes + 3;
  do {
    local_3f8 = local_3f8 + -1;
    std::unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_>::~unique_ptr(local_3f8);
  } while (local_3f8 !=
           (unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> *)&__range1);
  Graph::~Graph((Graph *)local_60);
  return graph._76_4_;
}

Assistant:

int main() {
    Graph graph;
    graph.from_kreach("data/sample.kreach");
    graph.compute_degree();

    unique_ptr<AbstractKReach> indexes[4];
    indexes[0].reset(new KReach(graph, 3));
    indexes[1].reset(new DynamicKReach(graph, 3));
    indexes[2].reset(new ScalableKReach(graph, 3, 1000, 10000));
    indexes[3].reset(new DynamicScalableKReach(graph, 3, 1000, 10000));

    for (auto &i : indexes){
        i->construct();
    }

    vector<pair<vertex_t, vertex_t>> edges;
    for (vertex_t s = 0; s < graph.num_vertices(); ++s) {
        for (vertex_t t : graph.successors(s)) {
            edges.push_back(make_pair(s, t));
        }
    }

    /*
     * Edge operations
     */
    for (const auto &p : edges) {
        auto s = p.first;
        auto t = p.second;
        cout << s << " " << t << endl;

        graph.remove_edge(s, t);

        for (auto &i : indexes){
            i->remove_edge(s, t);
        }
        for (const auto &i : indexes){
            for (const auto &j : indexes){
                equals(graph, *i, *j);
            }
        }

        graph.insert_edge(s, t);

        for (auto &i : indexes){
            i->insert_edge(s, t);
        }
        for (const auto &i : indexes){
            for (const auto &j : indexes){
                equals(graph, *i, *j);
            }
        }

    }

    /*
     * Vertex operations
     */
    for (vertex_t s = 0; s < graph.num_vertices(); ++s){
        cout << s << endl;
        auto out = move(graph.successors(s)), in = move(graph.predecessors(s));

        graph.remove_vertex(s);

        for (auto &i : indexes){
            i->remove_vertex(s, out, in);
        }
        for (const auto &i : indexes){
            for (const auto &j : indexes){
                equals(graph, *i, *j);
            }
        }

        graph.insert_vertex(s, out, in);

        for (auto &i : indexes){
            i->insert_vertex(s, out, in);
        }
        for (const auto &i : indexes){
            for (const auto &j : indexes){
                equals(graph, *i, *j);
            }
        }
    }

    return 0;
}